

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O1

void __thiscall
duckdb::StrfTimeFormat::ConvertTimestampVector
          (StrfTimeFormat *this,Vector *input,Vector *result,idx_t count)

{
  ulong *puVar1;
  anon_union_16_2_67f50693_for_value *paVar2;
  unsigned_long *puVar3;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  byte bVar6;
  timestamp_t tVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  StrfTimeFormat *this_00;
  SelectionVector *pSVar9;
  ulong uVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  data_ptr_t pdVar12;
  idx_t iVar13;
  data_ptr_t pdVar14;
  unsigned_long uVar15;
  idx_t idx_in_entry;
  ulong uVar16;
  ulong uVar17;
  string_t sVar18;
  anon_struct_16_3_d7536bce_for_pointer aVar19;
  UnifiedVectorFormat vdata;
  data_ptr_t local_c0;
  timestamp_t local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_b0;
  data_ptr_t local_a8;
  ulong local_a0;
  StrfTimeFormat *local_98;
  ValidityMask *local_90;
  ulong local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    local_c0 = result->data;
    local_a8 = input->data;
    FlatVector::VerifyFlatVector(input);
    FlatVector::VerifyFlatVector(result);
    if ((input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        local_c0 = local_c0 + 8;
        iVar13 = 0;
        do {
          local_78.sel = *(SelectionVector **)(local_a8 + iVar13 * 8);
          sVar18 = ConvertTimestampValue(this,(timestamp_t *)&local_78,result);
          *(long *)(local_c0 + -8) = sVar18.value._0_8_;
          *(long *)local_c0 = sVar18.value._8_8_;
          iVar13 = iVar13 + 1;
          local_c0 = local_c0 + 0x10;
        } while (count != iVar13);
      }
    }
    else {
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = count;
      local_b8.value = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_78,(unsigned_long **)&input->validity,(unsigned_long *)&local_b8);
      pdVar14 = local_78.data;
      pSVar9 = local_78.sel;
      local_78.sel = (SelectionVector *)0x0;
      local_78.data = (data_ptr_t)0x0;
      p_Var5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)pSVar9;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar14;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data);
      }
      pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)
           (pTVar11->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      if (0x3f < count + 0x3f) {
        local_a0 = count + 0x3f >> 6;
        local_88 = 0;
        uVar16 = 0;
        local_98 = this;
        local_90 = &input->validity;
        do {
          this_00 = local_98;
          pdVar14 = local_a8;
          puVar3 = (local_90->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (puVar3 == (unsigned_long *)0x0) {
            uVar15 = 0xffffffffffffffff;
          }
          else {
            uVar15 = puVar3[local_88];
          }
          uVar10 = uVar16 + 0x40;
          if (count <= uVar16 + 0x40) {
            uVar10 = count;
          }
          uVar17 = uVar10;
          if (uVar15 != 0) {
            uVar17 = uVar16;
            if (uVar15 == 0xffffffffffffffff) {
              if (uVar16 < uVar10) {
                pdVar12 = local_c0 + uVar16 * 0x10 + 8;
                do {
                  local_78.sel = *(SelectionVector **)(pdVar14 + uVar17 * 8);
                  sVar18 = ConvertTimestampValue(this_00,(timestamp_t *)&local_78,result);
                  *(long *)(pdVar12 + -8) = sVar18.value._0_8_;
                  *(long *)pdVar12 = sVar18.value._8_8_;
                  uVar17 = uVar17 + 1;
                  pdVar12 = pdVar12 + 0x10;
                } while (uVar10 != uVar17);
              }
            }
            else if (uVar16 < uVar10) {
              pdVar12 = local_c0 + uVar16 * 0x10 + 8;
              uVar17 = 0;
              do {
                if ((uVar15 >> (uVar17 & 0x3f) & 1) != 0) {
                  local_78.sel = *(SelectionVector **)(pdVar14 + uVar17 * 8 + uVar16 * 8);
                  sVar18 = ConvertTimestampValue(local_98,(timestamp_t *)&local_78,result);
                  *(long *)(pdVar12 + -8) = sVar18.value._0_8_;
                  *(long *)pdVar12 = sVar18.value._8_8_;
                }
                uVar17 = uVar17 + 1;
                pdVar12 = pdVar12 + 0x10;
              } while ((uVar16 - uVar10) + uVar17 != 0);
              uVar17 = uVar16 + uVar17;
            }
          }
          local_88 = local_88 + 1;
          uVar16 = uVar17;
        } while (local_88 != local_a0);
      }
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    paVar2 = (anon_union_16_2_67f50693_for_value *)result->data;
    pdVar14 = input->data;
    puVar3 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
      return;
    }
    ConstantVector::SetNull(result,false);
    local_78.sel = *(SelectionVector **)pdVar14;
    aVar19 = (anon_struct_16_3_d7536bce_for_pointer)
             ConvertTimestampValue(this,(timestamp_t *)&local_78,result);
    paVar2->pointer = aVar19;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar14 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        _Var4._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (((unsafe_unique_array<unsigned_long> *)&(local_78.sel)->sel_vector)->
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
        pdVar14 = pdVar14 + 8;
        uVar16 = 0;
        do {
          uVar10 = uVar16;
          if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
              _Var4._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
            uVar10 = (ulong)*(uint *)((long)_Var4._M_t.
                                            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                            .super__Head_base<0UL,_unsigned_long_*,_false>.
                                            _M_head_impl + uVar16 * 4);
          }
          local_b8.value = (int64_t)((_func_int ***)local_78.data)[uVar10];
          sVar18 = ConvertTimestampValue(this,&local_b8,result);
          *(long *)(pdVar14 + -8) = sVar18.value._0_8_;
          *(long *)pdVar14 = sVar18.value._8_8_;
          uVar16 = uVar16 + 1;
          pdVar14 = pdVar14 + 0x10;
        } while (count != uVar16);
      }
    }
    else if (count != 0) {
      _Var4._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (((unsafe_unique_array<unsigned_long> *)&(local_78.sel)->sel_vector)->
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
      pdVar14 = pdVar14 + 8;
      uVar16 = 0;
      do {
        uVar10 = uVar16;
        if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
            _Var4._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
          uVar10 = (ulong)*(uint *)((long)_Var4._M_t.
                                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                          .super__Head_base<0UL,_unsigned_long_*,_false>.
                                          _M_head_impl + uVar16 * 4);
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar10 >> 6]
             >> (uVar10 & 0x3f) & 1) == 0) {
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_b8,&local_80);
            p_Var8 = p_Stack_b0;
            tVar7.value = local_b8.value;
            local_b8.value = 0;
            p_Stack_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)tVar7.value;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var8;
            if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
            }
            if (p_Stack_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_b0);
            }
            pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (unsigned_long *)
                 (pTVar11->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
          }
          bVar6 = (byte)uVar16 & 0x3f;
          puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                   (uVar16 >> 6);
          *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
        }
        else {
          local_b8.value = (int64_t)((_func_int ***)local_78.data)[uVar10];
          sVar18 = ConvertTimestampValue(this,&local_b8,result);
          *(long *)(pdVar14 + -8) = sVar18.value._0_8_;
          *(long *)pdVar14 = sVar18.value._8_8_;
        }
        uVar16 = uVar16 + 1;
        pdVar14 = pdVar14 + 0x10;
      } while (count != uVar16);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void StrfTimeFormat::ConvertTimestampVector(Vector &input, Vector &result, idx_t count) {
	D_ASSERT(input.GetType().id() == LogicalTypeId::TIMESTAMP || input.GetType().id() == LogicalTypeId::TIMESTAMP_TZ);
	D_ASSERT(result.GetType().id() == LogicalTypeId::VARCHAR);
	UnaryExecutor::ExecuteWithNulls<timestamp_t, string_t>(
	    input, result, count,
	    [&](timestamp_t input, ValidityMask &mask, idx_t idx) { return ConvertTimestampValue(input, result); });
}